

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS0.cpp
# Opt level: O2

bool __thiscall RTIMULSM9DS0::setGyroSampleRate(RTIMULSM9DS0 *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  RTIMUSettings *this_00;
  bool bVar4;
  byte bVar5;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_LSM9DS0GyroSampleRate;
  if ((ulong)uVar1 < 4) {
    uVar2 = *(uint *)(&DAT_0011fb70 + (ulong)uVar1 * 4);
    bVar5 = (char)uVar1 << 6;
    (this->super_RTIMU).m_sampleRate = uVar2;
    (this->super_RTIMU).m_sampleInterval = 1000000 / (ulong)uVar2;
    iVar3 = this_00->m_LSM9DS0GyroBW;
    if (iVar3 == 3) {
      bVar5 = bVar5 | 0x3f;
    }
    else if (iVar3 == 2) {
      bVar5 = bVar5 | 0x2f;
    }
    else if (iVar3 == 1) {
      bVar5 = bVar5 | 0x1f;
    }
    else {
      bVar5 = bVar5 | 0xf;
    }
    bVar4 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_gyroSlaveAddr,' ',bVar5,
                               "Failed to set LSM9DS0 gyro CTRL1");
    return bVar4;
  }
  fprintf(_stderr,"Illegal LSM9DS0 gyro sample rate code %d\n",(ulong)uVar1);
  return false;
}

Assistant:

bool RTIMULSM9DS0::setGyroSampleRate()
{
    unsigned char ctrl1;

    switch (m_settings->m_LSM9DS0GyroSampleRate) {
    case LSM9DS0_GYRO_SAMPLERATE_95:
        ctrl1 = 0x0f;
        m_sampleRate = 95;
        break;

    case LSM9DS0_GYRO_SAMPLERATE_190:
        ctrl1 = 0x4f;
        m_sampleRate = 190;
        break;

    case LSM9DS0_GYRO_SAMPLERATE_380:
        ctrl1 = 0x8f;
        m_sampleRate = 380;
        break;

    case LSM9DS0_GYRO_SAMPLERATE_760:
        ctrl1 = 0xcf;
        m_sampleRate = 760;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS0 gyro sample rate code %d\n", m_settings->m_LSM9DS0GyroSampleRate);
        return false;
    }

    m_sampleInterval = (uint64_t)1000000 / m_sampleRate;

    switch (m_settings->m_LSM9DS0GyroBW) {
    case LSM9DS0_GYRO_BANDWIDTH_0:
        ctrl1 |= 0x00;
        break;

    case LSM9DS0_GYRO_BANDWIDTH_1:
        ctrl1 |= 0x10;
        break;

    case LSM9DS0_GYRO_BANDWIDTH_2:
        ctrl1 |= 0x20;
        break;

    case LSM9DS0_GYRO_BANDWIDTH_3:
        ctrl1 |= 0x30;
        break;

    }

    return (m_settings->HALWrite(m_gyroSlaveAddr, LSM9DS0_GYRO_CTRL1, ctrl1, "Failed to set LSM9DS0 gyro CTRL1"));
}